

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int cert_stuff(Curl_easy *data,SSL_CTX *ctx,char *cert_file,curl_blob *cert_blob,char *cert_type,
              char *key_file,curl_blob *key_blob,char *key_type,char *key_passwd)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  BIO *pBVar8;
  X509 *pXVar9;
  ulong uVar10;
  long lVar11;
  BIO_METHOD *type;
  PKCS12 *p12;
  EVP_PKEY *pEVar12;
  UI_METHOD *method;
  UI_METHOD *pUVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSL *ssl;
  evp_pkey_st *peVar14;
  rsa_st *r;
  char *fmt;
  char *pcVar15;
  ENGINE *e;
  stack_st_X509 *ca;
  X509 *local_170;
  X509 *x509;
  anon_struct_16_2_531ec2c5 params;
  char error_buffer [256];
  
  iVar3 = do_file_type(cert_type);
  if (iVar3 != 0x2a && (cert_file == (char *)0x0 && cert_blob == (curl_blob *)0x0)) {
    return 1;
  }
  if (key_passwd != (char *)0x0) {
    SSL_CTX_set_default_passwd_cb_userdata((SSL_CTX *)ctx,key_passwd);
    SSL_CTX_set_default_passwd_cb((SSL_CTX *)ctx,passwd_callback);
  }
  if (iVar3 == 0x2b) {
    ca = (stack_st_X509 *)0x0;
    if (cert_blob == (curl_blob *)0x0) {
      type = BIO_s_file();
      pBVar8 = BIO_new(type);
      if (pBVar8 == (BIO *)0x0) {
        uVar10 = ERR_get_error();
        cert_type = ossl_strerror(uVar10,error_buffer,0x100);
        pcVar15 = "BIO_new return NULL, OpenSSL error %s";
        goto LAB_0057d111;
      }
      lVar11 = BIO_ctrl(pBVar8,0x6c,3,cert_file);
      if ((int)lVar11 < 1) {
        Curl_failf(data,"could not open PKCS12 file \'%s\'",cert_file);
        BIO_free(pBVar8);
        return 0;
      }
    }
    else {
      pBVar8 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
      if (pBVar8 == (BIO *)0x0) {
        uVar10 = ERR_get_error();
        cert_type = ossl_strerror(uVar10,error_buffer,0x100);
        pcVar15 = "BIO_new_mem_buf NULL, OpenSSL error %s";
        goto LAB_0057d111;
      }
    }
    p12 = d2i_PKCS12_bio(pBVar8,(PKCS12 **)0x0);
    BIO_free(pBVar8);
    if (p12 == (PKCS12 *)0x0) {
      cert_type = cert_file;
      if (cert_blob != (curl_blob *)0x0) {
        cert_type = "(memory blob)";
      }
      pcVar15 = "error reading PKCS12 file \'%s\'";
LAB_0057d111:
      Curl_failf(data,pcVar15,cert_type);
      return 0;
    }
    PKCS12_PBE_add();
    iVar5 = PKCS12_parse(p12,key_passwd,(EVP_PKEY **)&params,(X509 **)&x509,(stack_st_X509 **)&ca);
    if (iVar5 == 0) {
      uVar10 = ERR_get_error();
      pcVar15 = ossl_strerror(uVar10,error_buffer,0x100);
      Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",pcVar15);
      PKCS12_free(p12);
      return 0;
    }
    PKCS12_free(p12);
    iVar5 = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)x509);
    if (iVar5 == 1) {
      iVar5 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,(EVP_PKEY *)params.cert_id);
      if (iVar5 == 1) {
        iVar5 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
        if (iVar5 != 0) {
          if (ca != (stack_st_X509 *)0x0) {
            do {
              iVar5 = OPENSSL_sk_num(ca);
              if (iVar5 == 0) goto LAB_0057d55d;
              pXVar9 = (X509 *)OPENSSL_sk_pop(ca);
              iVar5 = SSL_CTX_add_client_CA((SSL_CTX *)ctx,pXVar9);
              if (iVar5 == 0) {
                X509_free(pXVar9);
                pcVar15 = "cannot add certificate to client CA list";
                goto LAB_0057d5c1;
              }
              lVar11 = SSL_CTX_ctrl((SSL_CTX *)ctx,0xe,0,pXVar9);
            } while (lVar11 != 0);
            X509_free(pXVar9);
            pcVar15 = "cannot add certificate to certificate chain";
LAB_0057d5c1:
            Curl_failf(data,pcVar15);
            goto LAB_0057d536;
          }
LAB_0057d55d:
          EVP_PKEY_free((EVP_PKEY *)params.cert_id);
          X509_free((X509 *)x509);
          OPENSSL_sk_pop_free(ca,X509_free);
          bVar1 = false;
          goto LAB_0057d18b;
        }
        pcVar15 = "private key from PKCS12 file \'%s\' does not match certificate in same file";
      }
      else {
        pcVar15 = "unable to use private key from PKCS12 file \'%s\'";
      }
    }
    else {
      uVar10 = ERR_get_error();
      cert_file = ossl_strerror(uVar10,error_buffer,0x100);
      pcVar15 = "could not load PKCS12 client certificate, OpenSSL error %s";
    }
    Curl_failf(data,pcVar15,cert_file);
LAB_0057d536:
    EVP_PKEY_free((EVP_PKEY *)params.cert_id);
    X509_free((X509 *)x509);
    OPENSSL_sk_pop_free(ca,X509_free);
    return 0;
  }
  if (iVar3 == 2) {
    if (cert_blob == (curl_blob *)0x0) {
      iVar5 = SSL_CTX_use_certificate_file((SSL_CTX *)ctx,cert_file,2);
LAB_0057ce7f:
      bVar1 = true;
      if (iVar5 == 1) goto LAB_0057d18b;
    }
    else {
      pBVar8 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
      if (pBVar8 != (BIO *)0x0) {
        iVar5 = 0;
        pXVar9 = d2i_X509_bio(pBVar8,(X509 **)0x0);
        if (pXVar9 != (X509 *)0x0) {
          iVar5 = SSL_CTX_use_certificate((SSL_CTX *)ctx,pXVar9);
        }
        X509_free(pXVar9);
        BIO_free(pBVar8);
        goto LAB_0057ce7f;
      }
    }
    if (cert_blob != (curl_blob *)0x0) {
      cert_file = "CURLOPT_SSLCERT_BLOB";
    }
    uVar10 = ERR_get_error();
    pcVar15 = ossl_strerror(uVar10,error_buffer,0x100);
    fmt = 
    "could not load ASN1 client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
    ;
    goto LAB_0057d266;
  }
  if (iVar3 != 0x2a) {
    if (iVar3 != 1) {
      pcVar15 = "not supported file type \'%s\' for certificate";
      goto LAB_0057d111;
    }
    if (cert_blob == (curl_blob *)0x0) {
      iVar5 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)ctx,cert_file);
LAB_0057d17f:
      bVar1 = true;
      if (iVar5 == 1) goto LAB_0057d18b;
    }
    else {
      pBVar8 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
      if (pBVar8 != (BIO *)0x0) {
        ERR_clear_error();
        pXVar9 = PEM_read_bio_X509_AUX(pBVar8,(X509 **)0x0,passwd_callback,key_passwd);
        iVar5 = 0;
        if (pXVar9 != (X509 *)0x0) {
          local_170 = pXVar9;
          iVar4 = SSL_CTX_use_certificate((SSL_CTX *)ctx,pXVar9);
          uVar10 = ERR_peek_error();
          if (uVar10 != 0) {
            iVar4 = 0;
          }
          pXVar9 = local_170;
          iVar5 = 0;
          if (iVar4 != 0) {
            lVar11 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x58,0,(void *)0x0);
            pXVar9 = local_170;
            iVar5 = 0;
            if (lVar11 != 0) {
              do {
                pXVar9 = PEM_read_bio_X509(pBVar8,(X509 **)0x0,passwd_callback,key_passwd);
                if (pXVar9 == (X509 *)0x0) {
                  uVar10 = ERR_peek_last_error();
                  pXVar9 = local_170;
                  iVar5 = 0;
                  if ((int)uVar10 == 0x480006c) {
                    ERR_clear_error();
                    pXVar9 = local_170;
                    iVar5 = iVar4;
                  }
                  goto LAB_0057d16f;
                }
                lVar11 = SSL_CTX_ctrl((SSL_CTX *)ctx,0x59,0,pXVar9);
              } while (lVar11 != 0);
              X509_free(pXVar9);
              pXVar9 = local_170;
              iVar5 = 0;
            }
          }
        }
LAB_0057d16f:
        X509_free(pXVar9);
        BIO_free(pBVar8);
        goto LAB_0057d17f;
      }
    }
    if (cert_blob != (curl_blob *)0x0) {
      cert_file = "CURLOPT_SSLCERT_BLOB";
    }
    uVar10 = ERR_get_error();
    pcVar15 = ossl_strerror(uVar10,error_buffer,0x100);
    fmt = 
    "could not load PEM client certificate from %s, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
    ;
    goto LAB_0057d266;
  }
  e = (ENGINE *)(data->state).engine;
  if (e == (ENGINE *)0x0) {
    _Var2 = is_pkcs11_uri(cert_file);
    if ((_Var2) && (CVar6 = ossl_set_engine(data,"pkcs11"), CVar6 != CURLE_OK)) {
      return 0;
    }
    e = (ENGINE *)(data->state).engine;
    if (e == (ENGINE *)0x0) {
      pcVar15 = "crypto engine not set, can\'t load certificate";
      goto LAB_0057d593;
    }
  }
  params.cert = (X509 *)0x0;
  params.cert_id = cert_file;
  iVar5 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
  if (iVar5 == 0) {
    pcVar15 = "ssl engine does not support loading certificates";
    goto LAB_0057d593;
  }
  iVar5 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&params,(f *)0x0,1);
  if (iVar5 == 0) {
    uVar10 = ERR_get_error();
    pcVar15 = ossl_strerror(uVar10,error_buffer,0x100);
    fmt = "ssl engine cannot load client cert with id \'%s\' [%s]";
    goto LAB_0057d266;
  }
  if (params.cert == (X509 *)0x0) {
    pcVar15 = "ssl engine didn\'t initialized the certificate properly.";
    goto LAB_0057d593;
  }
  iVar5 = SSL_CTX_use_certificate((SSL_CTX *)ctx,(X509 *)params.cert);
  if (iVar5 != 1) {
    uVar10 = ERR_get_error();
    cert_type = ossl_strerror(uVar10,error_buffer,0x100);
    pcVar15 = "unable to set client certificate [%s]";
    goto LAB_0057d111;
  }
  X509_free((X509 *)params.cert);
  bVar1 = true;
LAB_0057d18b:
  pcVar15 = cert_file;
  if (key_file != (char *)0x0 || key_blob != (curl_blob *)0x0) {
    iVar3 = do_file_type(key_type);
    cert_blob = key_blob;
    pcVar15 = key_file;
  }
  if (iVar3 == 0x2b) {
    if (bVar1) {
      pcVar15 = "file type P12 for private key not supported";
      goto LAB_0057d593;
    }
  }
  else {
    if (iVar3 == 2) {
LAB_0057d1e6:
      if (cert_blob == (curl_blob *)0x0) {
        iVar3 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)ctx,pcVar15,iVar3);
LAB_0057d3e2:
        if (iVar3 == 1) goto LAB_0057d3f0;
      }
      else {
        pBVar8 = BIO_new_mem_buf(cert_blob->data,(int)cert_blob->len);
        if (pBVar8 != (BIO *)0x0) {
          if (iVar3 == 1) {
            pEVar12 = PEM_read_bio_PrivateKey(pBVar8,(EVP_PKEY **)0x0,passwd_callback,key_passwd);
          }
          else {
            pEVar12 = d2i_PrivateKey_bio(pBVar8,(EVP_PKEY **)0x0);
          }
          if (pEVar12 == (EVP_PKEY *)0x0) {
            iVar3 = 0;
          }
          else {
            iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar12);
            EVP_PKEY_free(pEVar12);
          }
          BIO_free(pBVar8);
          goto LAB_0057d3e2;
        }
      }
      cert_file = "(memory blob)";
      if (pcVar15 != (char *)0x0) {
        cert_file = pcVar15;
      }
      pcVar15 = "PEM";
      if (key_type != (char *)0x0) {
        pcVar15 = key_type;
      }
      fmt = "unable to set private key file: \'%s\' type %s";
LAB_0057d266:
      Curl_failf(data,fmt,cert_file,pcVar15);
      return 0;
    }
    if (iVar3 == 0x2a) {
      if ((data->state).engine == (void *)0x0) {
        _Var2 = is_pkcs11_uri(pcVar15);
        if ((_Var2) && (CVar6 = ossl_set_engine(data,"pkcs11"), CVar6 != CURLE_OK)) {
          return 0;
        }
        if ((data->state).engine == (void *)0x0) {
          pcVar15 = "crypto engine not set, can\'t load private key";
          goto LAB_0057d593;
        }
      }
      method = UI_create_method("curl user interface");
      if (method == (UI_METHOD *)0x0) {
        pcVar15 = "unable do create OpenSSL user-interface method";
        goto LAB_0057d593;
      }
      pUVar13 = UI_OpenSSL();
      iVar3 = UI_method_get_opener((UI *)pUVar13);
      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar3));
      pUVar13 = UI_OpenSSL();
      iVar3 = UI_method_get_closer((UI *)pUVar13);
      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar3));
      UI_method_set_reader(method,ssl_ui_reader);
      UI_method_set_writer(method,ssl_ui_writer);
      pEVar12 = ENGINE_load_private_key((ENGINE *)(data->state).engine,pcVar15,method,key_passwd);
      UI_destroy_method(method);
      if (pEVar12 == (EVP_PKEY *)0x0) {
        pcVar15 = "failed to load private key from crypto engine";
        goto LAB_0057d593;
      }
      iVar3 = SSL_CTX_use_PrivateKey((SSL_CTX *)ctx,pEVar12);
      if (iVar3 != 1) {
        Curl_failf(data,"unable to set private key");
        EVP_PKEY_free(pEVar12);
        return 0;
      }
      EVP_PKEY_free(pEVar12);
    }
    else {
      if (iVar3 != 1) {
        pcVar15 = "not supported file type for private key";
        goto LAB_0057d593;
      }
      if (bVar1) goto LAB_0057d1e6;
    }
  }
LAB_0057d3f0:
  ssl = SSL_new((SSL_CTX *)ctx);
  if (ssl == (SSL *)0x0) {
    pcVar15 = "unable to create an SSL structure";
  }
  else {
    x509 = (X509 *)SSL_get_certificate(ssl);
    if ((X509 *)x509 != (X509 *)0x0) {
      pEVar12 = X509_get_pubkey((X509 *)x509);
      peVar14 = SSL_get_privatekey(ssl);
      EVP_PKEY_copy_parameters(pEVar12,peVar14);
      EVP_PKEY_free(pEVar12);
    }
    peVar14 = SSL_get_privatekey(ssl);
    iVar3 = EVP_PKEY_get_id(peVar14);
    if (iVar3 == 6) {
      r = EVP_PKEY_get1_RSA(peVar14);
      uVar7 = RSA_flags(r);
      RSA_free(r);
      SSL_free(ssl);
      if ((uVar7 & 1) != 0) {
        return 1;
      }
    }
    else {
      SSL_free(ssl);
    }
    iVar3 = SSL_CTX_check_private_key((SSL_CTX *)ctx);
    if (iVar3 != 0) {
      return 1;
    }
    pcVar15 = "Private key does not match the certificate public key";
  }
LAB_0057d593:
  Curl_failf(data,pcVar15);
  return 0;
}

Assistant:

static
int cert_stuff(struct Curl_easy *data,
               SSL_CTX* ctx,
               char *cert_file,
               const struct curl_blob *cert_blob,
               const char *cert_type,
               char *key_file,
               const struct curl_blob *key_blob,
               const char *key_type,
               char *key_passwd)
{
  char error_buffer[256];
  bool check_privkey = TRUE;

  int file_type = do_file_type(cert_type);

  if(cert_file || cert_blob || (file_type == SSL_FILETYPE_ENGINE)) {
    SSL *ssl;
    X509 *x509;
    int cert_done = 0;
    int cert_use_result;

    if(key_passwd) {
      /* set the password in the callback userdata */
      SSL_CTX_set_default_passwd_cb_userdata(ctx, key_passwd);
      /* Set passwd callback: */
      SSL_CTX_set_default_passwd_cb(ctx, passwd_callback);
    }


    switch(file_type) {
    case SSL_FILETYPE_PEM:
      /* SSL_CTX_use_certificate_chain_file() only works on PEM files */
      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_chain_blob(ctx, cert_blob, key_passwd) :
        SSL_CTX_use_certificate_chain_file(ctx, cert_file);
      if(cert_use_result != 1) {
        failf(data,
              "could not load PEM client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;

    case SSL_FILETYPE_ASN1:
      /* SSL_CTX_use_certificate_file() works with either PEM or ASN1, but
         we use the case above for PEM so this can only be performed with
         ASN1 files. */

      cert_use_result = cert_blob ?
        SSL_CTX_use_certificate_blob(ctx, cert_blob,
                                     file_type, key_passwd) :
      SSL_CTX_use_certificate_file(ctx, cert_file, file_type);
      if(cert_use_result != 1) {
        failf(data,
              "could not load ASN1 client certificate from %s, " OSSL_PACKAGE
              " error %s, "
              "(no key found, wrong pass phrase, or wrong file format?)",
              (cert_blob ? "CURLOPT_SSLCERT_BLOB" : cert_file),
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#if defined(USE_OPENSSL_ENGINE) && defined(ENGINE_CTRL_GET_CMD_FROM_NAME)
    {
      /* Implicitly use pkcs11 engine if none was provided and the
       * cert_file is a PKCS#11 URI */
      if(!data->state.engine) {
        if(is_pkcs11_uri(cert_file)) {
          if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
            return 0;
          }
        }
      }

      if(data->state.engine) {
        const char *cmd_name = "LOAD_CERT_CTRL";
        struct {
          const char *cert_id;
          X509 *cert;
        } params;

        params.cert_id = cert_file;
        params.cert = NULL;

        /* Does the engine supports LOAD_CERT_CTRL ? */
        if(!ENGINE_ctrl(data->state.engine, ENGINE_CTRL_GET_CMD_FROM_NAME,
                        0, (void *)cmd_name, NULL)) {
          failf(data, "ssl engine does not support loading certificates");
          return 0;
        }

        /* Load the certificate from the engine */
        if(!ENGINE_ctrl_cmd(data->state.engine, cmd_name,
                            0, &params, NULL, 1)) {
          failf(data, "ssl engine cannot load client cert with id"
                " '%s' [%s]", cert_file,
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)));
          return 0;
        }

        if(!params.cert) {
          failf(data, "ssl engine didn't initialized the certificate "
                "properly.");
          return 0;
        }

        if(SSL_CTX_use_certificate(ctx, params.cert) != 1) {
          failf(data, "unable to set client certificate [%s]",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)));
          return 0;
        }
        X509_free(params.cert); /* we don't need the handle any more... */
      }
      else {
        failf(data, "crypto engine not set, can't load certificate");
        return 0;
      }
    }
    break;
#else
    failf(data, "file type ENG for certificate not implemented");
    return 0;
#endif

    case SSL_FILETYPE_PKCS12:
    {
      BIO *cert_bio = NULL;
      PKCS12 *p12 = NULL;
      EVP_PKEY *pri;
      STACK_OF(X509) *ca = NULL;
      if(cert_blob) {
        cert_bio = BIO_new_mem_buf(cert_blob->data, (int)(cert_blob->len));
        if(!cert_bio) {
          failf(data,
                "BIO_new_mem_buf NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }
      }
      else {
        cert_bio = BIO_new(BIO_s_file());
        if(!cert_bio) {
          failf(data,
                "BIO_new return NULL, " OSSL_PACKAGE
                " error %s",
                ossl_strerror(ERR_get_error(), error_buffer,
                              sizeof(error_buffer)) );
          return 0;
        }

        if(BIO_read_filename(cert_bio, cert_file) <= 0) {
          failf(data, "could not open PKCS12 file '%s'", cert_file);
          BIO_free(cert_bio);
          return 0;
        }
      }

      p12 = d2i_PKCS12_bio(cert_bio, NULL);
      BIO_free(cert_bio);

      if(!p12) {
        failf(data, "error reading PKCS12 file '%s'",
              cert_blob ? "(memory blob)" : cert_file);
        return 0;
      }

      PKCS12_PBE_add();

      if(!PKCS12_parse(p12, key_passwd, &pri, &x509,
                       &ca)) {
        failf(data,
              "could not parse PKCS12 file, check password, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        PKCS12_free(p12);
        return 0;
      }

      PKCS12_free(p12);

      if(SSL_CTX_use_certificate(ctx, x509) != 1) {
        failf(data,
              "could not load PKCS12 client certificate, " OSSL_PACKAGE
              " error %s",
              ossl_strerror(ERR_get_error(), error_buffer,
                            sizeof(error_buffer)) );
        goto fail;
      }

      if(SSL_CTX_use_PrivateKey(ctx, pri) != 1) {
        failf(data, "unable to use private key from PKCS12 file '%s'",
              cert_file);
        goto fail;
      }

      if(!SSL_CTX_check_private_key (ctx)) {
        failf(data, "private key from PKCS12 file '%s' "
              "does not match certificate in same file", cert_file);
        goto fail;
      }
      /* Set Certificate Verification chain */
      if(ca) {
        while(sk_X509_num(ca)) {
          /*
           * Note that sk_X509_pop() is used below to make sure the cert is
           * removed from the stack properly before getting passed to
           * SSL_CTX_add_extra_chain_cert(), which takes ownership. Previously
           * we used sk_X509_value() instead, but then we'd clean it in the
           * subsequent sk_X509_pop_free() call.
           */
          X509 *x = sk_X509_pop(ca);
          if(!SSL_CTX_add_client_CA(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to client CA list");
            goto fail;
          }
          if(!SSL_CTX_add_extra_chain_cert(ctx, x)) {
            X509_free(x);
            failf(data, "cannot add certificate to certificate chain");
            goto fail;
          }
        }
      }

      cert_done = 1;
fail:
      EVP_PKEY_free(pri);
      X509_free(x509);
      sk_X509_pop_free(ca, X509_free);
      if(!cert_done)
        return 0; /* failure! */
      break;
    }
    default:
      failf(data, "not supported file type '%s' for certificate", cert_type);
      return 0;
    }

    if((!key_file) && (!key_blob)) {
      key_file = cert_file;
      key_blob = cert_blob;
    }
    else
      file_type = do_file_type(key_type);

    switch(file_type) {
    case SSL_FILETYPE_PEM:
      if(cert_done)
        break;
      FALLTHROUGH();
    case SSL_FILETYPE_ASN1:
      cert_use_result = key_blob ?
        SSL_CTX_use_PrivateKey_blob(ctx, key_blob, file_type, key_passwd) :
      SSL_CTX_use_PrivateKey_file(ctx, key_file, file_type);
      if(cert_use_result != 1) {
        failf(data, "unable to set private key file: '%s' type %s",
              key_file?key_file:"(memory blob)", key_type?key_type:"PEM");
        return 0;
      }
      break;
    case SSL_FILETYPE_ENGINE:
#ifdef USE_OPENSSL_ENGINE
    {
      EVP_PKEY *priv_key = NULL;

      /* Implicitly use pkcs11 engine if none was provided and the
       * key_file is a PKCS#11 URI */
      if(!data->state.engine) {
        if(is_pkcs11_uri(key_file)) {
          if(ossl_set_engine(data, "pkcs11") != CURLE_OK) {
            return 0;
          }
        }
      }

      if(data->state.engine) {
        UI_METHOD *ui_method =
          UI_create_method((char *)"curl user interface");
        if(!ui_method) {
          failf(data, "unable do create " OSSL_PACKAGE
                " user-interface method");
          return 0;
        }
        UI_method_set_opener(ui_method, UI_method_get_opener(UI_OpenSSL()));
        UI_method_set_closer(ui_method, UI_method_get_closer(UI_OpenSSL()));
        UI_method_set_reader(ui_method, ssl_ui_reader);
        UI_method_set_writer(ui_method, ssl_ui_writer);
        priv_key = ENGINE_load_private_key(data->state.engine, key_file,
                                           ui_method,
                                           key_passwd);
        UI_destroy_method(ui_method);
        if(!priv_key) {
          failf(data, "failed to load private key from crypto engine");
          return 0;
        }
        if(SSL_CTX_use_PrivateKey(ctx, priv_key) != 1) {
          failf(data, "unable to set private key");
          EVP_PKEY_free(priv_key);
          return 0;
        }
        EVP_PKEY_free(priv_key);  /* we don't need the handle any more... */
      }
      else {
        failf(data, "crypto engine not set, can't load private key");
        return 0;
      }
    }
    break;
#else
    failf(data, "file type ENG for private key not supported");
    return 0;
#endif
    case SSL_FILETYPE_PKCS12:
      if(!cert_done) {
        failf(data, "file type P12 for private key not supported");
        return 0;
      }
      break;
    default:
      failf(data, "not supported file type for private key");
      return 0;
    }

    ssl = SSL_new(ctx);
    if(!ssl) {
      failf(data, "unable to create an SSL structure");
      return 0;
    }

    x509 = SSL_get_certificate(ssl);

    /* This version was provided by Evan Jordan and is supposed to not
       leak memory as the previous version: */
    if(x509) {
      EVP_PKEY *pktmp = X509_get_pubkey(x509);
      EVP_PKEY_copy_parameters(pktmp, SSL_get_privatekey(ssl));
      EVP_PKEY_free(pktmp);
    }

#if !defined(OPENSSL_NO_RSA) && !defined(OPENSSL_IS_BORINGSSL) &&       \
  !defined(OPENSSL_NO_DEPRECATED_3_0)
    {
      /* If RSA is used, don't check the private key if its flags indicate
       * it doesn't support it. */
      EVP_PKEY *priv_key = SSL_get_privatekey(ssl);
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(priv_key);
#else
      pktype = priv_key->type;
#endif
      if(pktype == EVP_PKEY_RSA) {
        RSA *rsa = EVP_PKEY_get1_RSA(priv_key);
        if(RSA_flags(rsa) & RSA_METHOD_FLAG_NO_CHECK)
          check_privkey = FALSE;
        RSA_free(rsa); /* Decrement reference count */
      }
    }
#endif

    SSL_free(ssl);

    /* If we are using DSA, we can copy the parameters from
     * the private key */

    if(check_privkey == TRUE) {
      /* Now we know that a key and cert have been set against
       * the SSL context */
      if(!SSL_CTX_check_private_key(ctx)) {
        failf(data, "Private key does not match the certificate public key");
        return 0;
      }
    }
  }
  return 1;
}